

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
* __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
::child(btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
        *this,size_type i)

{
  bool bVar1;
  
  bVar1 = leaf(this);
  if (bVar1) {
    __assert_fail("N < 3 || !leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x482,
                  "const typename layout_type::template ElementType<N> *phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>>::GetField() const [Params = phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>, N = 3UL]"
                 );
  }
  if (((ulong)this & 7) == 0) {
    return *(btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
             **)(this + i * 8 + 0x100);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 3UL, Char = const char]"
               );
}

Assistant:

btree_node *child(size_type i) const { return GetField<3>()[i]; }